

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall Engine::toggleVSIDS(Engine *this)

{
  uint uVar1;
  BranchGroup *pBVar2;
  Branching **__ptr;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  TrailElem local_40;
  
  bVar3 = so.vsids;
  pBVar2 = this->branching;
  __ptr = (pBVar2->x).data;
  uVar1 = (pBVar2->x).sz;
  uVar5 = (ulong)uVar1;
  (pBVar2->x).sz = 0;
  (pBVar2->x).cap = 0;
  (pBVar2->x).data = (Branching **)0x0;
  if (bVar3) {
    if (1 < uVar1) {
      uVar4 = 1;
      do {
        (*(this->branching->super_Branching)._vptr_Branching[3])(this->branching,__ptr[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    pBVar2 = this->branching;
    local_40.pt = &(pBVar2->fin).v;
    local_40.x = (pBVar2->fin).v;
    local_40.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_40);
    (pBVar2->fin).v = 0;
    pBVar2 = this->branching;
    local_40.pt = &(pBVar2->cur).v;
    local_40.x = (pBVar2->cur).v;
    local_40.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_40);
    (pBVar2->cur).v = -1;
    so.vsids = false;
  }
  else {
    (*(this->branching->super_Branching)._vptr_Branching[3])(this->branching,&sat);
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        (*(this->branching->super_Branching)._vptr_Branching[3])(this->branching,__ptr[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    pBVar2 = this->branching;
    local_40.pt = &(pBVar2->fin).v;
    local_40.x = (pBVar2->fin).v;
    local_40.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_40);
    (pBVar2->fin).v = 0;
    pBVar2 = this->branching;
    local_40.pt = &(pBVar2->cur).v;
    local_40.x = (pBVar2->cur).v;
    local_40.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_40);
    (pBVar2->cur).v = -1;
    so.vsids = true;
  }
  if (__ptr != (Branching **)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Engine::toggleVSIDS() const {
	if (!so.vsids) {
		vec<Branching*> old_x;
		branching->x.moveTo(old_x);
		branching->add(&sat);
		for (unsigned int i = 0; i < old_x.size(); i++) {
			branching->add(old_x[i]);
		}
		branching->fin = 0;
		branching->cur = -1;
		so.vsids = true;
	} else {
		vec<Branching*> old_x;
		branching->x.moveTo(old_x);
		for (unsigned int i = 1; i < old_x.size(); i++) {
			branching->add(old_x[i]);
		}
		branching->fin = 0;
		branching->cur = -1;
		so.vsids = false;
	}
}